

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_protocol.cpp
# Opt level: O0

void ReadTicCmd(BYTE **stream,int player,int tic)

{
  BYTE *data;
  short sVar1;
  short sVar2;
  short sVar3;
  int iVar4;
  usercmd_t *ucmd;
  ticcmd_t *ptVar5;
  int iVar6;
  usercmd_t *local_48;
  int ticmod;
  ticcmd_t *tcmd;
  BYTE *start;
  int type;
  int tic_local;
  int player_local;
  BYTE **stream_local;
  
  iVar6 = tic % 0x24;
  ucmd = &netcmds[player][iVar6].ucmd;
  iVar4 = ReadWord(stream);
  *(short *)&ucmd[1].buttons = (short)iVar4;
  data = *stream;
  while (iVar4 = ReadByte(stream), iVar4 != 1 && iVar4 != 2) {
    Net_SkipCommand(iVar4,stream);
  }
  FDynamicBuffer::SetData(NetSpecs[player] + iVar6,data,((int)*stream - (int)data) + -1);
  if (iVar4 == 1) {
    if (tic == 0) {
      local_48 = (usercmd_t *)0x0;
    }
    else {
      local_48 = &netcmds[player][(tic + -1) % 0x24].ucmd;
    }
    UnpackUserCmd(ucmd,local_48,stream);
  }
  else if (tic == 0) {
    memset(ucmd,0,0x10);
  }
  else {
    ptVar5 = netcmds[player] + (tic + -1) % 0x24;
    sVar1 = (ptVar5->ucmd).pitch;
    sVar2 = (ptVar5->ucmd).yaw;
    ucmd->buttons = (ptVar5->ucmd).buttons;
    ucmd->pitch = sVar1;
    ucmd->yaw = sVar2;
    sVar1 = (ptVar5->ucmd).forwardmove;
    sVar2 = (ptVar5->ucmd).sidemove;
    sVar3 = (ptVar5->ucmd).upmove;
    ucmd->roll = (ptVar5->ucmd).roll;
    ucmd->forwardmove = sVar1;
    ucmd->sidemove = sVar2;
    ucmd->upmove = sVar3;
  }
  if (((player == consoleplayer) && (0x24 < tic)) &&
     (consistancy[player][iVar6] != (short)ucmd[1].buttons)) {
    __assert_fail("consistancy[player][ticmod] == tcmd->consistancy",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/d_protocol.cpp"
                  ,0x1c1,"void ReadTicCmd(BYTE **, int, int)");
  }
  return;
}

Assistant:

void ReadTicCmd (BYTE **stream, int player, int tic)
{
	int type;
	BYTE *start;
	ticcmd_t *tcmd;

	int ticmod = tic % BACKUPTICS;

	tcmd = &netcmds[player][ticmod];
	tcmd->consistancy = ReadWord (stream);

	start = *stream;

	while ((type = ReadByte (stream)) != DEM_USERCMD && type != DEM_EMPTYUSERCMD)
		Net_SkipCommand (type, stream);

	NetSpecs[player][ticmod].SetData (start, int(*stream - start - 1));

	if (type == DEM_USERCMD)
	{
		UnpackUserCmd (&tcmd->ucmd,
			tic ? &netcmds[player][(tic-1)%BACKUPTICS].ucmd : NULL, stream);
	}
	else
	{
		if (tic)
		{
			memcpy (&tcmd->ucmd, &netcmds[player][(tic-1)%BACKUPTICS].ucmd, sizeof(tcmd->ucmd));
		}
		else
		{
			memset (&tcmd->ucmd, 0, sizeof(tcmd->ucmd));
		}
	}

	if (player==consoleplayer&&tic>BACKUPTICS)
		assert(consistancy[player][ticmod] == tcmd->consistancy);
}